

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::GLSL420Pack::InitializerListTest::getVectorSum_abi_cxx11_
          (string *__return_storage_ptr__,InitializerListTest *this,GLchar *vector_name,GLuint size)

{
  undefined4 local_2c;
  GLuint i;
  GLuint size_local;
  GLchar *vector_name_local;
  InitializerListTest *this_local;
  string *sum;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (local_2c = 0; local_2c < size; local_2c = local_2c + 1) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    if (local_2c + 1 < size) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InitializerListTest::getVectorSum(const GLchar* vector_name, GLuint size)
{
	static const GLchar* lut[] = {
		".x", ".y", ".z", ".w",
	};

	std::string sum;

	for (GLuint i = 0; i < size; ++i)
	{
		sum.append(vector_name);
		sum.append(lut[i]);

		if (i + 1 < size)
		{
			sum.append(" + ");
		}
	}

	return sum;
}